

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_other_examples.cpp
# Opt level: O0

void badDecoding_corruptChecksum(void)

{
  uint uVar1;
  undefined1 *puVar2;
  bool local_91;
  undefined1 local_80 [8];
  DecodedResult decodedResult;
  allocator<char> local_29;
  undefined1 local_28 [8];
  string bstr;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_28,"example1qpzry9x8ge8sqgv",&local_29);
  std::allocator<char>::~allocator(&local_29);
  puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_28);
  *puVar2 = 0x71;
  bech32::decode((DecodedResult *)local_80,(string *)local_28);
  uVar1 = std::__cxx11::string::empty();
  local_91 = false;
  if ((uVar1 & 1) != 0) {
    local_91 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          ((long)&decodedResult.hrp.field_2 + 8));
  }
  if (local_91 != false) {
    if (local_80._0_4_ != Invalid) {
      __assert_fail("bech32::Encoding::Invalid == decodedResult.encoding",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/examples/cpp_other_examples.cpp"
                    ,0x72,"void badDecoding_corruptChecksum()");
    }
    bech32::DecodedResult::~DecodedResult((DecodedResult *)local_80);
    std::__cxx11::string::~string((string *)local_28);
    return;
  }
  __assert_fail("decodedResult.hrp.empty() && decodedResult.dp.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/examples/cpp_other_examples.cpp"
                ,0x71,"void badDecoding_corruptChecksum()");
}

Assistant:

void badDecoding_corruptChecksum() {

    // valid bech32 string
    std::string bstr = "example1qpzry9x8ge8sqgv";
    // simulate corrupted checksum--verification will fail
    bstr[19] = 'q';

    // decode
    bech32::DecodedResult decodedResult = bech32::decode(bstr);

    // verify decoding failed
    assert(decodedResult.hrp.empty() && decodedResult.dp.empty());
    assert(bech32::Encoding::Invalid == decodedResult.encoding);
}